

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_table_info.cpp
# Opt level: O2

ColumnConstraintInfo duckdb::CheckConstraints(TableCatalogEntry *table,ColumnDefinition *column)

{
  pointer puVar1;
  pointer pbVar2;
  pointer pbVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  bool bVar7;
  bool bVar8;
  vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
  *pvVar9;
  pointer pCVar10;
  NotNullConstraint *pNVar11;
  LogicalIndex LVar12;
  UniqueConstraint *this;
  LogicalIndex LVar13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *pvVar14;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var15;
  pointer this_00;
  uint3 uVar16;
  string local_50;
  
  pvVar9 = TableCatalogEntry::GetConstraints(table);
  this_00 = (pvVar9->
            super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (pvVar9->
           super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar16 = 0;
  bVar4 = 0;
  bVar5 = 0;
  do {
    if (this_00 == puVar1) {
      return (ColumnConstraintInfo)((uint3)bVar5 << 8 | (uint3)bVar4 << 0x10 | uVar16);
    }
    pCVar10 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
              operator->(this_00);
    bVar6 = bVar4;
    if (pCVar10->type == UNIQUE) {
      pCVar10 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                operator->(this_00);
      this = Constraint::Cast<duckdb::UniqueConstraint>(pCVar10);
      bVar7 = UniqueConstraint::IsPrimaryKey(this);
      bVar8 = UniqueConstraint::HasIndex(this);
      if (bVar8) {
        LVar12 = UniqueConstraint::GetIndex(this);
        LVar13 = ColumnDefinition::Logical(column);
        if (LVar12.index == LVar13.index) {
LAB_0086249c:
          bVar6 = 1;
          if (bVar7) {
            bVar5 = 1;
            bVar6 = bVar4;
          }
        }
      }
      else {
        pvVar14 = UniqueConstraint::GetColumnNames_abi_cxx11_(this);
        pbVar2 = (pvVar14->
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pbVar3 = (pvVar14->
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        ColumnDefinition::GetName_abi_cxx11_(&local_50,column);
        _Var15 = ::std::
                 __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                           (pbVar2,pbVar3,&local_50);
        pbVar2 = (pvVar14->
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        ::std::__cxx11::string::~string((string *)&local_50);
        if (_Var15._M_current != pbVar2) goto LAB_0086249c;
      }
    }
    else if (pCVar10->type == NOT_NULL) {
      pCVar10 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                operator->(this_00);
      pNVar11 = Constraint::Cast<duckdb::NotNullConstraint>(pCVar10);
      LVar12 = ColumnDefinition::Logical(column);
      if ((pNVar11->index).index == LVar12.index) {
        uVar16 = 1;
      }
    }
    bVar4 = bVar6;
    this_00 = this_00 + 1;
  } while( true );
}

Assistant:

static ColumnConstraintInfo CheckConstraints(TableCatalogEntry &table, const ColumnDefinition &column) {
	ColumnConstraintInfo result;
	// check all constraints
	for (auto &constraint : table.GetConstraints()) {
		switch (constraint->type) {
		case ConstraintType::NOT_NULL: {
			auto &not_null = constraint->Cast<NotNullConstraint>();
			if (not_null.index == column.Logical()) {
				result.not_null = true;
			}
			break;
		}
		case ConstraintType::UNIQUE: {
			auto &unique = constraint->Cast<UniqueConstraint>();
			bool &constraint_info = unique.IsPrimaryKey() ? result.pk : result.unique;
			if (unique.HasIndex()) {
				if (unique.GetIndex() == column.Logical()) {
					constraint_info = true;
				}
			} else {
				auto &columns = unique.GetColumnNames();
				if (std::find(columns.begin(), columns.end(), column.GetName()) != columns.end()) {
					constraint_info = true;
				}
			}
			break;
		}
		default:
			break;
		}
	}
	return result;
}